

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subgraph.cpp
# Opt level: O2

void __thiscall Gecko::Subgraph::optimize(Subgraph *this,uint p)

{
  Subnode *pSVar1;
  float fVar2;
  WeightedValue WVar3;
  ulong uVar4;
  Graph *pGVar5;
  Index l;
  byte bVar6;
  uint uVar7;
  int iVar8;
  pointer pNVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint m;
  uint uVar14;
  ulong uVar15;
  Float pos;
  uint local_74;
  ulong local_70;
  float local_68;
  int local_64;
  long local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> external;
  
  pNVar9 = (this->g->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar13 = (this->g->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[p];
  local_68 = pNVar9[uVar13].pos - pNVar9[uVar13].hlen;
  (this->min).super_WeightedValue = (WeightedValue)0x3f8000007f7fffff;
  bVar10 = 0;
  while( true ) {
    uVar13 = 1;
    uVar4 = (ulong)bVar10;
    if (this->n <= (uint)bVar10) break;
    this->perm[uVar4] = bVar10;
    this->best[uVar4] = bVar10;
    pGVar5 = this->g;
    uVar13 = (pGVar5->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[bVar10 + p];
    this->adj[uVar4] = 0;
    external.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    external.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    external.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pNVar9 = (pGVar5->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_74 = pNVar9[uVar13 - 1].arc;
    local_60 = (ulong)uVar13 << 4;
    local_70 = uVar4;
    while( true ) {
      if (*(uint *)((long)&pNVar9->arc + local_60) <= local_74) break;
      uVar4 = 0;
      while( true ) {
        uVar13 = (uint)uVar4;
        if ((this->n <= uVar13) ||
           ((pGVar5->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar13 + p] ==
            (pGVar5->adj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[local_74])) break;
        uVar4 = (ulong)(byte)((byte)uVar4 + 1);
      }
      if (this->n == uVar13) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&external,&local_74);
        pGVar5 = this->g;
        pNVar9 = (pGVar5->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      else {
        this->adj[local_70] = this->adj[local_70] + (1 << ((byte)uVar4 & 0x1f));
        *(float *)((long)this->weight[0] + uVar4 * 4 + (ulong)(uint)((int)local_70 << 6)) =
             (pGVar5->weight).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[local_74];
      }
      local_74 = local_74 + 1;
    }
    uVar13 = this->n;
    uVar11 = 1 << ((byte)local_70 & 0x1f);
    this->node[local_70] = this->cache + ((int)local_70 << ((byte)uVar13 & 0x1f));
    local_64 = uVar11 - 1;
    uVar4 = 0;
    while( true ) {
      uVar7 = 1 << ((byte)uVar13 & 0x1f);
      uVar14 = (uint)uVar4;
      if (uVar7 <= uVar14) break;
      if ((uVar14 & uVar11) == 0) {
        iVar8 = (int)local_70 << ((byte)uVar13 & 0x1f);
        pSVar1 = this->cache + (long)iVar8 + uVar4;
        pGVar5 = this->g;
        pNVar9 = (pGVar5->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pos = *(float *)((long)&pNVar9->hlen + local_60) + local_68;
        this->cache[(long)iVar8 + uVar4].pos = pos;
        for (bVar6 = 0; bVar6 < uVar13; bVar6 = bVar6 + 1) {
          if ((bVar10 != bVar6) && ((uVar14 >> (bVar6 & 0x1f) & 1) == 0)) {
            fVar2 = pNVar9[(pGVar5->perm).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start[bVar6 + p]].hlen;
            pos = pos + fVar2 + fVar2;
            pSVar1->pos = pos;
          }
        }
        WVar3 = (WeightedValue)Graph::cost(pGVar5,&external,pos);
        (pSVar1->cost).super_WeightedValue = WVar3;
        uVar13 = this->n;
      }
      else {
        uVar14 = uVar14 + local_64;
      }
      uVar4 = (ulong)(uVar14 + 1);
    }
    this->node[local_70] = this->node[local_70] + (uVar7 + (-2 << (bVar10 & 0x1f)));
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&external.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    bVar10 = bVar10 + 1;
  }
  optimize(this,(WeightedSum)0x0,this->n);
  uVar4 = (ulong)this->n;
  for (uVar15 = 0; uVar15 < uVar4; uVar15 = uVar15 + 1) {
    Graph::swap(this->g,(int)uVar15 + p,this->best[uVar15] + p);
    uVar4 = (ulong)this->n;
    for (uVar12 = (ulong)uVar13; uVar12 < uVar4; uVar12 = uVar12 + 1) {
      if (uVar15 == this->best[uVar12]) {
        this->best[uVar12] = this->best[uVar15];
      }
    }
    uVar13 = uVar13 + 1;
  }
  return;
}

Assistant:

void
Subgraph::optimize(uint p)
{
  // Initialize subgraph.
  const Float q = g->node[g->perm[p]].pos - g->node[g->perm[p]].hlen;
  min = WeightedSum(GECKO_FLOAT_MAX, 1);
  for (Subnode::Index k = 0; k < n; k++) {
    best[k] = perm[k] = k;
    Node::Index i = g->perm[p + k];
    // Copy i's outgoing arcs.  We distinguish between internal
    // and external arcs to nodes within and outside the subgraph,
    // respectively.
#if GECKO_WITH_ADJLIST
    uint m = 0;
#else
    adj[k] = 0;
#endif
    std::vector<Arc::Index> external;
    for (Arc::Index a = g->node_begin(i); a < g->node_end(i); a++) {
      Node::Index j = g->adj[a];
      Subnode::Index l;
      for (l = 0; l < n && g->perm[p + l] != j; l++);
      if (l == n)
        external.push_back(a);
      else {
        // Copy internal arc to subgraph.
#if GECKO_WITH_ADJLIST
        adj[k][m] = l;
        weight[k][m] = g->weight[a];
        m++;
#else
        adj[k] += 1u << l;
        weight[k][l] = g->weight[a];
#endif
      }
    }
#if GECKO_WITH_ADJLIST
    adj[k][m] = k;
#endif
    // Precompute external costs associated with all possible positions
    // of this node.  Since node lengths can be arbitrary, there are as
    // many as 2^(n-1) possible positions, each corresponding to an
    // (n-1)-bit string that specifies whether the remaining n-1 nodes
    // succeed this node or not.  Caching the
    //                n
    //   2^(n-1) n = sum k C(n, k) = A001787
    //               k=1
    // external costs is exponentially cheaper than recomputing the
    //      n-1         n
    //   n! sum 1/k! = sum k! C(n, k) = A007526
    //      k=0        k=1
    // costs associated with all permutations.
    node[k] = cache + (k << n);
    for (uint m = 0; m < (1u << n); m++)
      if (!(m & (1u << k))) {
        Subnode* s = cache + (k << n) + m;
        s->pos = q + g->node[i].hlen;
        for (Subnode::Index l = 0; l < n; l++)
          if (l != k && !(m & (1u << l)))
            s->pos += 2 * g->node[g->perm[p + l]].hlen;
        s->cost = g->cost(external, s->pos);
      }
      else
        m += (1u << k) - 1;
    node[k] += (1u << n) - (2u << k);
  }

  // Find optimal permutation of the n nodes.
  optimize(0, n);

  // Apply permutation to original graph.
  for (uint i = 0; i < n; i++) {
    g->swap(p + i, p + best[i]);
    for (uint j = i + 1; j < n; j++)
      if (best[j] == i)
        best[j] = best[i];
  }
}